

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void move(Terminal *term,wchar_t x,wchar_t y,wchar_t marg_clip)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  if (marg_clip != L'\0') {
    wVar3 = term->marg_t;
    wVar1 = y;
    if (y < wVar3) {
      wVar1 = wVar3;
    }
    wVar2 = (term->curs).y;
    if (wVar3 <= wVar2) {
      y = wVar1;
    }
    if (marg_clip == L'\x02') {
      y = wVar1;
    }
    wVar3 = term->marg_b;
    wVar1 = wVar3;
    if (y < wVar3) {
      wVar1 = y;
    }
    if (wVar2 <= wVar3) {
      y = wVar1;
    }
    if (marg_clip == L'\x02') {
      y = wVar1;
    }
  }
  if (x < L'\x01') {
    x = L'\0';
  }
  wVar3 = term->cols + L'\xffffffff';
  if (x < term->cols) {
    wVar3 = x;
  }
  wVar1 = L'\0';
  if (L'\0' < y) {
    wVar1 = y;
  }
  wVar2 = term->rows + L'\xffffffff';
  if (wVar1 < term->rows) {
    wVar2 = wVar1;
  }
  (term->curs).x = wVar3;
  (term->curs).y = wVar2;
  term->wrapnext = false;
  return;
}

Assistant:

static void move(Terminal *term, int x, int y, int marg_clip)
{
    if (x < 0)
        x = 0;
    if (x >= term->cols)
        x = term->cols - 1;
    if (marg_clip) {
        if ((term->curs.y >= term->marg_t || marg_clip == 2) &&
            y < term->marg_t)
            y = term->marg_t;
        if ((term->curs.y <= term->marg_b || marg_clip == 2) &&
            y > term->marg_b)
            y = term->marg_b;
    }
    if (y < 0)
        y = 0;
    if (y >= term->rows)
        y = term->rows - 1;
    term->curs.x = x;
    term->curs.y = y;
    term->wrapnext = false;
}